

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O1

void __thiscall IlmThread_3_4::Semaphore::post(Semaphore *this)

{
  int iVar1;
  long *local_30 [2];
  long local_20 [2];
  
  iVar1 = sem_post((sem_t *)&this->_semaphore);
  if (iVar1 != 0) {
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,"Post operation on semaphore failed (%T).","");
    Iex_3_4::throwErrnoExc((string *)local_30);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return;
}

Assistant:

void
Semaphore::post ()
{
    if (::sem_post (&_semaphore))
        IEX_NAMESPACE::throwErrnoExc (
            "Post operation on semaphore failed (%T).");
}